

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawTestCaseUtil.hpp
# Opt level: O2

string * __thiscall
vkt::Draw::ShaderSourceProvider::getSource_abi_cxx11_
          (string *__return_storage_ptr__,ShaderSourceProvider *this,Archive *archive,char *path)

{
  pointer puVar1;
  Resource *pRVar2;
  int iVar3;
  uint uVar4;
  vector<unsigned_char,_std::allocator<unsigned_char>_> readBuffer;
  UniquePtr<tcu::Resource,_de::DefaultDeleter<tcu::Resource>_> resource;
  allocator_type local_41;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_40;
  UniqueBase<tcu::Resource,_de::DefaultDeleter<tcu::Resource>_> local_28;
  
  local_28.m_data.ptr = (Resource *)(**(code **)(*(long *)this + 0x10))(this,archive);
  iVar3 = (*(local_28.m_data.ptr)->_vptr_Resource[3])(local_28.m_data.ptr);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_40,(long)(iVar3 + 1),
             &local_41);
  pRVar2 = local_28.m_data.ptr;
  puVar1 = local_40._M_impl.super__Vector_impl_data._M_start;
  uVar4 = (*(local_28.m_data.ptr)->_vptr_Resource[3])(local_28.m_data.ptr);
  (*pRVar2->_vptr_Resource[2])(pRVar2,puVar1,(ulong)uVar4);
  local_40._M_impl.super__Vector_impl_data._M_finish[-1] = '\0';
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,
             (char *)local_40._M_impl.super__Vector_impl_data._M_start,(allocator<char> *)&local_41)
  ;
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_40);
  de::details::UniqueBase<tcu::Resource,_de::DefaultDeleter<tcu::Resource>_>::~UniqueBase(&local_28)
  ;
  return __return_storage_ptr__;
}

Assistant:

static std::string getSource (tcu::Archive& archive, const char* path)
	{
		de::UniquePtr<tcu::Resource> resource(archive.getResource(path));

		std::vector<deUint8> readBuffer(resource->getSize() + 1);
		resource->read(&readBuffer[0], resource->getSize());
		readBuffer[readBuffer.size() - 1] = 0;

		return std::string(reinterpret_cast<const char*>(&readBuffer[0]));
	}